

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcon.c
# Opt level: O3

bson_t * bcon_new(void *unused,...)

{
  char in_AL;
  bson_t *bson;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  bcon_append_ctx_t ctx;
  __va_list_tag local_6650;
  undefined1 local_6630 [8];
  undefined8 local_6628;
  undefined8 local_6620;
  undefined8 local_6618;
  undefined8 local_6610;
  undefined8 local_6608;
  undefined8 local_6600;
  undefined8 local_65f0;
  undefined8 local_65e0;
  undefined8 local_65d0;
  undefined8 local_65c0;
  undefined8 local_65b0;
  undefined8 local_65a0;
  undefined8 local_6590;
  bcon_append_ctx_t local_6580;
  
  if (in_AL != '\0') {
    local_6600 = in_XMM0_Qa;
    local_65f0 = in_XMM1_Qa;
    local_65e0 = in_XMM2_Qa;
    local_65d0 = in_XMM3_Qa;
    local_65c0 = in_XMM4_Qa;
    local_65b0 = in_XMM5_Qa;
    local_65a0 = in_XMM6_Qa;
    local_6590 = in_XMM7_Qa;
  }
  local_6580.n = 0;
  local_6580.stack[0].is_array = false;
  local_6628 = in_RSI;
  local_6620 = in_RDX;
  local_6618 = in_RCX;
  local_6610 = in_R8;
  local_6608 = in_R9;
  bson = bson_new();
  local_6650.gp_offset = 8;
  local_6650.fp_offset = 0x30;
  local_6650.overflow_arg_area = &stack0x00000008;
  local_6650.reg_save_area = local_6630;
  bcon_append_ctx_va(bson,&local_6580,(va_list *)&local_6650);
  return bson;
}

Assistant:

bson_t *
bcon_new (void *unused, ...)
{
   va_list ap;
   bcon_append_ctx_t ctx;
   bson_t *bson;

   bcon_append_ctx_init (&ctx);

   bson = bson_new ();

   va_start (ap, unused);

   bcon_append_ctx_va (bson, &ctx, &ap);

   va_end (ap);

   return bson;
}